

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::file_close(void *user_data)

{
  FILE *__stream;
  FILE *file;
  void *user_data_local;
  
  __stream = (FILE *)to_file(user_data);
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return;
}

Assistant:

void file_close(void* user_data)
	{
		FILE* file = to_file(user_data);
		if (file) {
			fclose(file);
		}
#if LOGURU_WITH_FILEABS
		delete reinterpret_cast<FileAbs*>(user_data);
#endif
	}